

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O0

void av1_init_warp_params
               (InterPredParams *inter_pred_params,WarpTypesAllowed *warp_types,int ref,
               MACROBLOCKD *xd,MB_MODE_INFO *mi)

{
  int iVar1;
  long in_RCX;
  undefined4 in_EDX;
  WarpTypesAllowed *in_RSI;
  MB_MODE_INFO *in_RDI;
  scale_factors *in_R8;
  undefined4 in_stack_ffffffffffffffe8;
  
  if ((((7 < *(int *)((in_RDI->palette_mode_info).palette_colors + 0xb)) &&
       (7 < *(int *)((in_RDI->palette_mode_info).palette_colors + 9))) &&
      (*(int *)(in_RCX + 0x29e8) == 0)) &&
     (iVar1 = allow_warp(in_RDI,in_RSI,
                         (WarpedMotionParams *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                         (int)((ulong)in_RCX >> 0x20),in_R8,(WarpedMotionParams *)0x6c6e7a),
     iVar1 != 0)) {
    in_RDI->bsize = BLOCK_4X8;
    in_RDI->partition = '\0';
    in_RDI->mode = '\0';
    in_RDI->uv_mode = '\0';
  }
  return;
}

Assistant:

void av1_init_warp_params(InterPredParams *inter_pred_params,
                          const WarpTypesAllowed *warp_types, int ref,
                          const MACROBLOCKD *xd, const MB_MODE_INFO *mi) {
  if (inter_pred_params->block_height < 8 || inter_pred_params->block_width < 8)
    return;

  if (xd->cur_frame_force_integer_mv) return;

  if (allow_warp(mi, warp_types, &xd->global_motion[mi->ref_frame[ref]], 0,
                 inter_pred_params->scale_factors,
                 &inter_pred_params->warp_params)) {
#if CONFIG_REALTIME_ONLY && !CONFIG_AV1_DECODER
    aom_internal_error(xd->error_info, AOM_CODEC_UNSUP_FEATURE,
                       "Warped motion is disabled in realtime only build.");
#endif  // CONFIG_REALTIME_ONLY && !CONFIG_AV1_DECODER
    inter_pred_params->mode = WARP_PRED;
  }
}